

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
::QueryPoolGraphicStatisticsTest
          (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
           *this,TestContext *context,char *name,char *description,
          ParametersGraphic parametersGraphic)

{
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  *this_00;
  allocator<char> local_169;
  long *local_168 [2];
  long local_158 [2];
  value_type local_148;
  float local_120 [2];
  float afStack_118 [2];
  float local_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  float local_f0 [2];
  float afStack_e8 [2];
  float local_e0 [2];
  float afStack_d8 [2];
  float local_d0 [2];
  float afStack_c8 [2];
  float local_c0 [2];
  float afStack_b8 [2];
  float local_b0 [2];
  float afStack_a8 [2];
  float local_a0 [2];
  float afStack_98 [2];
  float local_90 [2];
  float afStack_88 [2];
  float local_80 [2];
  float afStack_78 [2];
  float local_70 [2];
  float afStack_68 [2];
  float local_60 [2];
  float afStack_58 [2];
  float local_50 [2];
  float afStack_48 [2];
  float local_40 [2];
  float afStack_38 [2];
  float local_30 [2];
  float afStack_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,name,&local_169);
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"");
  tcu::TestCase::TestCase
            ((TestCase *)this,context,(char *)local_148.position.m_data._0_8_,(char *)local_168[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00cec1f0;
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if ((Vec4 *)local_148.position.m_data._0_8_ != &local_148.color) {
    operator_delete((void *)local_148.position.m_data._0_8_,local_148.color.m_data._0_8_ + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolGraphicStatisticsTest_00cfc120;
  this_00 = &this->m_data;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_parametersGraphic = (ParametersGraphic)description;
  local_168[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = -1.0;
  local_148.position.m_data[1] = -1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_30[0];
  local_148.color.m_data[1] = local_30[1];
  local_148.color.m_data[2] = afStack_28[0];
  local_148.color.m_data[3] = afStack_28[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = -1.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_40[0];
  local_148.color.m_data[1] = local_40[1];
  local_148.color.m_data[2] = afStack_38[0];
  local_148.color.m_data[3] = afStack_38[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = -1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_50[0];
  local_148.color.m_data[1] = local_50[1];
  local_148.color.m_data[2] = afStack_48[0];
  local_148.color.m_data[3] = afStack_48[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_60[0];
  local_148.color.m_data[1] = local_60[1];
  local_148.color.m_data[2] = afStack_58[0];
  local_148.color.m_data[3] = afStack_58[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = -1.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_70[0];
  local_148.color.m_data[1] = local_70[1];
  local_148.color.m_data[2] = afStack_68[0];
  local_148.color.m_data[3] = afStack_68[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = -1.0;
  local_148.position.m_data[1] = 1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_80[0];
  local_148.color.m_data[1] = local_80[1];
  local_148.color.m_data[2] = afStack_78[0];
  local_148.color.m_data[3] = afStack_78[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_90[0];
  local_148.color.m_data[1] = local_90[1];
  local_148.color.m_data[2] = afStack_88[0];
  local_148.color.m_data[3] = afStack_88[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = 1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_a0[0];
  local_148.color.m_data[1] = local_a0[1];
  local_148.color.m_data[2] = afStack_98[0];
  local_148.color.m_data[3] = afStack_98[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = -1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_b0[0];
  local_148.color.m_data[1] = local_b0[1];
  local_148.color.m_data[2] = afStack_a8[0];
  local_148.color.m_data[3] = afStack_a8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_c0[0];
  local_148.color.m_data[1] = local_c0[1];
  local_148.color.m_data[2] = afStack_b8[0];
  local_148.color.m_data[3] = afStack_b8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 1.0;
  local_148.position.m_data[1] = -1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_d0[0];
  local_148.color.m_data[1] = local_d0[1];
  local_148.color.m_data[2] = afStack_c8[0];
  local_148.color.m_data[3] = afStack_c8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 1.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_e0[0];
  local_148.color.m_data[1] = local_e0[1];
  local_148.color.m_data[2] = afStack_d8[0];
  local_148.color.m_data[3] = afStack_d8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff808080;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_f0[0];
  local_148.color.m_data[1] = local_f0[1];
  local_148.color.m_data[2] = afStack_e8[0];
  local_148.color.m_data[3] = afStack_e8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff808080;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 0.0;
  local_148.position.m_data[1] = 1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_100[0];
  local_148.color.m_data[1] = local_100[1];
  local_148.color.m_data[2] = afStack_f8[0];
  local_148.color.m_data[3] = afStack_f8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0]._0_4_ = 0xff808080;
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 1.0;
  local_148.position.m_data[1] = 0.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_110[0];
  local_148.color.m_data[1] = local_110[1];
  local_148.color.m_data[2] = afStack_108[0];
  local_148.color.m_data[3] = afStack_108[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  local_168[0] = (long *)CONCAT44(local_168[0]._4_4_,0xff808080);
  tcu::RGBA::toVec((RGBA *)local_168);
  local_148.position.m_data[0] = 1.0;
  local_148.position.m_data[1] = 1.0;
  local_148.position.m_data[2] = 1.0;
  local_148.position.m_data[3] = 1.0;
  local_148.color.m_data[0] = local_120[0];
  local_148.color.m_data[1] = local_120[1];
  local_148.color.m_data[2] = afStack_118[0];
  local_148.color.m_data[3] = afStack_118[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_148);
  return;
}

Assistant:

QueryPoolGraphicStatisticsTest (tcu::TestContext &context, const char *name, const char *description, const GraphicBasicTestInstance::ParametersGraphic parametersGraphic)
		: TestCase				(context, name, description)
		, m_parametersGraphic	(parametersGraphic)
	{
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
	}